

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,Address *address,ConfidentialAssetId *asset,Amount *amount)

{
  Script SStack_58;
  
  core::Address::GetLockingScript(&SStack_58,address);
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut,&SStack_58);
  Script::~Script(&SStack_58);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_0025a0a0;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,amount);
  ConfidentialNonce::ConfidentialNonce(&this->nonce_);
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const Address &address, const ConfidentialAssetId &asset,
    const Amount &amount)
    : AbstractTxOut(address.GetLockingScript()),
      asset_(asset),
      confidential_value_(ConfidentialValue(amount)),
      nonce_(),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}